

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O1

void cmExtraEclipseCDT4Generator::AddEnvVar(cmGeneratedFileStream *fout,char *envVar,cmMakefile *mf)

{
  char *pcVar1;
  cmState *this;
  char *pcVar2;
  cmake *pcVar3;
  long lVar4;
  size_t sVar5;
  ostream *poVar6;
  string valueToUse;
  string cacheEntryName;
  allocator local_99;
  cmGeneratedFileStream *local_98;
  char *local_90;
  char *local_88;
  char local_80;
  undefined7 uStack_7f;
  string local_70;
  string local_50;
  
  local_98 = fout;
  pcVar1 = getenv(envVar);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CMAKE_ECLIPSE_ENVVAR_","");
  std::__cxx11::string::append((char *)&local_50);
  this = cmMakefile::GetState(mf);
  pcVar2 = cmState::GetInitializedCacheValue(this,&local_50);
  local_90 = &local_80;
  local_88 = (char *)0x0;
  local_80 = '\0';
  if (pcVar1 == (char *)0x0 && pcVar2 == (char *)0x0) {
    pcVar2 = "";
LAB_002f82ae:
    std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)0x0,(ulong)pcVar2);
  }
  else {
    if (pcVar1 == (char *)0x0 || pcVar2 != (char *)0x0) {
      strlen(pcVar2);
      if (pcVar2 != (char *)0x0 && pcVar1 == (char *)0x0) goto LAB_002f82ae;
      std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)0x0,(ulong)pcVar2);
      strlen(pcVar1);
      lVar4 = std::__cxx11::string::find((char *)&local_90,(ulong)pcVar1,0);
      pcVar2 = local_88;
      if (lVar4 != -1) goto LAB_002f83cf;
      strlen(pcVar1);
      std::__cxx11::string::_M_replace((ulong)&local_90,0,pcVar2,(ulong)pcVar1);
      cmMakefile::AddCacheDefinition(mf,&local_50,local_90,local_50._M_dataplus._M_p,STRING,true);
      pcVar3 = cmMakefile::GetCMakeInstance(mf);
      pcVar1 = cmMakefile::GetHomeOutputDirectory(mf);
      std::__cxx11::string::string((string *)&local_70,pcVar1,&local_99);
      cmake::SaveCache(pcVar3,&local_70);
    }
    else {
      strlen(pcVar1);
      std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)0x0,(ulong)pcVar1);
      cmMakefile::AddCacheDefinition(mf,&local_50,local_90,local_50._M_dataplus._M_p,STRING,true);
      pcVar3 = cmMakefile::GetCMakeInstance(mf);
      pcVar1 = cmMakefile::GetHomeOutputDirectory(mf);
      std::__cxx11::string::string((string *)&local_70,pcVar1,&local_99);
      cmake::SaveCache(pcVar3,&local_70);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
LAB_002f83cf:
  if (local_88 != (char *)0x0) {
    if (envVar == (char *)0x0) {
      std::ios::clear((int)local_98 +
                      (int)(local_98->super_ofstream).
                           super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                           [-3]);
    }
    else {
      sVar5 = strlen(envVar);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_98,envVar,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_98,"=",1);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_98,local_90,(long)local_88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"|",1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::AddEnvVar(cmGeneratedFileStream& fout,
                                            const char* envVar, cmMakefile* mf)
{
  // get the variables from the environment and from the cache and then
  // figure out which one to use:

  const char* envVarValue = getenv(envVar);

  std::string cacheEntryName = "CMAKE_ECLIPSE_ENVVAR_";
  cacheEntryName += envVar;
  const char* cacheValue = mf->GetState()->GetInitializedCacheValue(
                                                       cacheEntryName);

  // now we have both, decide which one to use
  std::string valueToUse;
  if (envVarValue==0 && cacheValue==0)
    {
    // nothing known, do nothing
    valueToUse = "";
    }
  else if (envVarValue!=0 && cacheValue==0)
    {
    // The variable is in the env, but not in the cache. Use it and put it
    // in the cache
    valueToUse = envVarValue;
    mf->AddCacheDefinition(cacheEntryName, valueToUse.c_str(),
                           cacheEntryName.c_str(), cmState::STRING,
                           true);
    mf->GetCMakeInstance()->SaveCache(mf->GetHomeOutputDirectory());
    }
  else if (envVarValue==0 && cacheValue!=0)
    {
    // It is already in the cache, but not in the env, so use it from the cache
    valueToUse = cacheValue;
    }
  else
    {
    // It is both in the cache and in the env.
    // Use the version from the env. except if the value from the env is
    // completely contained in the value from the cache (for the case that we
    // now have a PATH without MSVC dirs in the env. but had the full PATH with
    // all MSVC dirs during the cmake run which stored the var in the cache:
    valueToUse = cacheValue;
    if (valueToUse.find(envVarValue) == std::string::npos)
      {
      valueToUse = envVarValue;
      mf->AddCacheDefinition(cacheEntryName, valueToUse.c_str(),
                             cacheEntryName.c_str(), cmState::STRING,
                             true);
      mf->GetCMakeInstance()->SaveCache(mf->GetHomeOutputDirectory());
      }
    }

  if (!valueToUse.empty())
    {
    fout << envVar << "=" << valueToUse << "|";
    }
}